

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrect.h
# Opt level: O0

void __thiscall QRect::moveTo(QRect *this,int ax,int ay)

{
  QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
  other;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  long in_FS_OFFSET;
  Representation ray;
  Representation rax;
  QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
  *in_stack_ffffffffffffffb8;
  QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
  in_stack_ffffffffffffffc8;
  QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
  local_10;
  QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
  local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c.m_i = -0x55555556;
  QtPrivate::QCheckedIntegers::
  QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
  ::QCheckedInt(&local_c,in_ESI);
  local_10.m_i = -0x55555556;
  QtPrivate::QCheckedIntegers::
  QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
  ::QCheckedInt(&local_10,in_EDX);
  other = QtPrivate::QCheckedIntegers::operator-
                    (in_stack_ffffffffffffffc8,(int)((ulong)in_RDI >> 0x20));
  QtPrivate::QCheckedIntegers::
  QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
  ::operator+=(in_stack_ffffffffffffffb8,other);
  QtPrivate::QCheckedIntegers::operator-
            (in_stack_ffffffffffffffc8,
             (QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
              )(int)((ulong)in_RDI >> 0x20));
  QtPrivate::QCheckedIntegers::
  QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
  ::operator+=(in_stack_ffffffffffffffb8,other);
  *in_RDI = local_c.m_i;
  in_RDI[1] = local_10.m_i;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

constexpr inline void QRect::moveTo(int ax, int ay) noexcept
{
    Representation rax(ax);
    Representation ray(ay);
    x2 += rax - x1;
    y2 += ray - y1;
    x1 = rax;
    y1 = ray;
}